

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O2

void __thiscall
soplex::SPxMainSM<double>::FreeZeroObjVariablePS::FreeZeroObjVariablePS
          (FreeZeroObjVariablePS *this,SPxLPBase<double> *lp,int _j,bool loFree,
          DSVectorBase<double> *col_idx_sorted,shared_ptr<soplex::Tolerances> *tols)

{
  DSVectorBase<double> *this_00;
  double dVar1;
  int iVar2;
  Nonzero<double> *pNVar3;
  undefined7 in_register_00000009;
  VectorBase<double> *pVVar4;
  long lVar5;
  long lVar6;
  int k;
  int i;
  long lVar7;
  double local_48;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  PostStep::PostStep(&this->super_PostStep,"FreeZeroObjVariable",
                     (shared_ptr<soplex::Tolerances> *)&local_40,
                     (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum,
                     (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__FreeZeroObjVariablePS_0053e890;
  this->m_j = _j;
  this->m_old_j = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum + -1;
  this->m_old_i = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum + -1;
  pVVar4 = &(lp->super_LPColSetBase<double>).low;
  if ((int)CONCAT71(in_register_00000009,loFree) != 0) {
    pVVar4 = &(lp->super_LPColSetBase<double>).up;
  }
  this->m_bnd = (pVVar4->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[_j];
  DSVectorBase<double>::DSVectorBase(&this->m_col,col_idx_sorted);
  this_00 = &this->m_lRhs;
  DSVectorBase<double>::DSVectorBase
            (this_00,(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem
                     [(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[_j].idx].
                     data.super_SVectorBase<double>.memused);
  DSVectorBase<double>::DSVectorBase
            (&this->m_rowObj,
             (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem
             [(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[_j].idx].data.
             super_SVectorBase<double>.memused);
  Array<soplex::DSVectorBase<double>_>::Array
            (&this->m_rows,
             (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem
             [(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[_j].idx].data.
             super_SVectorBase<double>.memused);
  this->m_loFree = loFree;
  lVar5 = 4;
  lVar6 = 0;
  lVar7 = 0;
  do {
    if ((this->m_col).super_SVectorBase<double>.memused <= lVar7) {
      return;
    }
    pNVar3 = (this->m_col).super_SVectorBase<double>.m_elem;
    iVar2 = *(int *)((long)&pNVar3->val + lVar5 * 2);
    dVar1 = *(double *)((long)pNVar3 + lVar5 * 2 + -8);
    i = (int)lVar7;
    if (this->m_loFree == true) {
      if (dVar1 <= 0.0) goto LAB_001bde16;
LAB_001bde3a:
      DSVectorBase<double>::add
                (this_00,i,
                 (lp->super_LPRowSetBase<double>).right.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start + iVar2);
    }
    else {
      if (dVar1 < 0.0) goto LAB_001bde3a;
LAB_001bde16:
      DSVectorBase<double>::add
                (this_00,i,
                 (lp->super_LPRowSetBase<double>).left.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start + iVar2);
    }
    DSVectorBase<double>::operator=
              ((DSVectorBase<double> *)
               ((long)&((this->m_rows).data.
                        super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_vptr_DSVectorBase + lVar6),
               (SVectorBase<double> *)
               ((lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
               (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[iVar2].idx));
    local_48 = (lp->super_LPRowSetBase<double>).object.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[iVar2];
    if (lp->thesense == MINIMIZE) {
      local_48 = -local_48;
    }
    DSVectorBase<double>::add(&this->m_rowObj,i,&local_48);
    lVar7 = lVar7 + 1;
    lVar6 = lVar6 + 0x20;
    lVar5 = lVar5 + 8;
  } while( true );
}

Assistant:

FreeZeroObjVariablePS(const SPxLPBase<R>& lp, int _j, bool loFree,
                            DSVectorBase<R> col_idx_sorted, std::shared_ptr<Tolerances> tols)
         : PostStep("FreeZeroObjVariable", tols, lp.nRows(), lp.nCols())
         , m_j(_j)
         , m_old_j(lp.nCols() - 1)
         , m_old_i(lp.nRows() - 1)
         , m_bnd(loFree ? lp.upper(_j) : lp.lower(_j))
         , m_col(col_idx_sorted)
         , m_lRhs(lp.colVector(_j).size())
         , m_rowObj(lp.colVector(_j).size())
         , m_rows(lp.colVector(_j).size())
         , m_loFree(loFree)
      {
         for(int k = 0; k < m_col.size(); ++k)
         {
            int r = m_col.index(k);

            if((m_loFree  && m_col.value(k) > 0) ||
                  (!m_loFree && m_col.value(k) < 0))
               m_lRhs.add(k, lp.rhs(r));
            else
               m_lRhs.add(k, lp.lhs(r));

            m_rows[k] = lp.rowVector(r);
            m_rowObj.add(k, lp.rowObj(r));
         }
      }